

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O1

Prefix * __thiscall
duckdb::Prefix::Append(Prefix *__return_storage_ptr__,Prefix *this,ART *art,uint8_t byte)

{
  byte bVar1;
  Node *pNVar2;
  undefined7 uVar3;
  Prefix prefix;
  Prefix local_38;
  
  bVar1 = this->data[art->prefix_count];
  if (bVar1 == art->prefix_count) {
    NewInternal(&local_38,art,this->ptr,(data_ptr_t)0x0,'\0',0,PREFIX);
    Append(__return_storage_ptr__,&local_38,art,byte);
  }
  else {
    this->data[bVar1] = byte;
    this->data[art->prefix_count] = this->data[art->prefix_count] + '\x01';
    uVar3 = *(undefined7 *)&this->field_0x11;
    __return_storage_ptr__->in_memory = this->in_memory;
    *(undefined7 *)&__return_storage_ptr__->field_0x11 = uVar3;
    pNVar2 = this->ptr;
    __return_storage_ptr__->data = this->data;
    __return_storage_ptr__->ptr = pNVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

Prefix Prefix::Append(ART &art, const uint8_t byte) {
	if (data[Count(art)] != Count(art)) {
		data[data[Count(art)]] = byte;
		data[Count(art)]++;
		return *this;
	}

	auto prefix = NewInternal(art, *ptr, nullptr, 0, 0, PREFIX);
	return prefix.Append(art, byte);
}